

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O2

int __thiscall ncnn::Interp::forward(Interp *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  int y;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint _h;
  ulong uVar7;
  uint uVar8;
  uint _c;
  uint _w;
  int iVar9;
  int iVar10;
  int iVar11;
  int c;
  void *pvVar12;
  ulong uVar13;
  int local_70;
  Mat top_blob_c;
  
  _w = this->output_width;
  _h = this->output_height;
  if (bottom_blob->dims == 1) {
    uVar8 = 1;
    uVar1 = 1;
    _c = bottom_blob->w;
  }
  else {
    uVar8 = bottom_blob->h;
    _c = bottom_blob->c;
    uVar1 = bottom_blob->w;
  }
  if (_w == 0 || _h == 0) {
    _h = (uint)((float)(int)uVar8 * this->height_scale);
    _w = (uint)((float)(int)uVar1 * this->width_scale);
  }
  if ((_h == uVar8) && (_w == uVar1)) {
    Mat::operator=(top_blob,bottom_blob);
  }
  else {
    Mat::create(top_blob,_w,_h,_c,bottom_blob->elemsize,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if (bottom_blob->dims == 1) {
      if ((int)_c < 1) {
        _c = 0;
      }
      for (uVar13 = 0; _c != uVar13; uVar13 = uVar13 + 1) {
        Mat::channel(&top_blob_c,top_blob,(int)uVar13);
        Mat::fill(&top_blob_c,*(float *)((long)bottom_blob->data + uVar13 * 4));
        Mat::~Mat(&top_blob_c);
      }
    }
    else {
      uVar2 = this->resize_type;
      if (uVar2 == 2) {
        resize_bilinear(bottom_blob,top_blob,_w,_h,(Allocator *)0x0,1);
        return 0;
      }
      if (uVar2 != 1) {
        fprintf(_stderr,"unsupported resize type %d %d %d\n",(ulong)uVar2,(ulong)_h,(ulong)_w);
        return -0xe9;
      }
      uVar13 = 0;
      if (0 < (int)_w) {
        uVar13 = (ulong)_w;
      }
      uVar6 = (ulong)_h;
      if ((int)_h < 1) {
        uVar6 = 0;
      }
      uVar4 = (ulong)_c;
      if ((int)_c < 1) {
        uVar4 = 0;
      }
      for (c = 0; local_70 = (int)uVar4, c != local_70; c = c + 1) {
        Mat::channel(&top_blob_c,bottom_blob,c);
        pvVar3 = top_blob_c.data;
        Mat::~Mat(&top_blob_c);
        Mat::channel(&top_blob_c,top_blob,c);
        pvVar12 = top_blob_c.data;
        Mat::~Mat(&top_blob_c);
        for (uVar5 = 0; uVar5 != uVar6; uVar5 = uVar5 + 1) {
          iVar11 = (int)((float)(int)uVar5 / this->height_scale);
          if ((int)(uVar8 - 1) < iVar11) {
            iVar11 = uVar8 - 1;
          }
          for (uVar7 = 0; uVar13 != uVar7; uVar7 = uVar7 + 1) {
            iVar10 = (int)((float)(int)uVar7 / this->width_scale);
            iVar9 = uVar1 - 1;
            if (iVar10 <= (int)(uVar1 - 1)) {
              iVar9 = iVar10;
            }
            *(undefined4 *)((long)pvVar12 + uVar7 * 4) =
                 *(undefined4 *)((long)pvVar3 + (long)(int)(iVar9 + iVar11 * uVar1) * 4);
          }
          pvVar12 = (void *)((long)pvVar12 + (long)(int)_w * 4);
        }
      }
    }
  }
  return 0;
}

Assistant:

int Interp::forward(const Mat &bottom_blob, Mat &top_blob, const Option& opt) const
{
    int h = bottom_blob.h;
    int w = bottom_blob.w;
    int c = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int oh = output_height;
    int ow = output_width;
    if (bottom_blob.dims == 1)
    {
        h = 1;
        w = 1;
        c = bottom_blob.w;
    }
    if (oh == 0 || ow == 0)
    {
        oh = h * height_scale;
        ow = w * width_scale;
    }
    if (oh == h && ow == w)
    {
        top_blob = bottom_blob;
        return 0;
    }
    top_blob.create(ow, oh, c, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (bottom_blob.dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            Mat top_blob_c = top_blob.channel(q);
            const float *ptr = ((const float*)bottom_blob.data + q);
            top_blob_c.fill(*ptr);
        }
        return 0;
    }

    if (resize_type == 1)//nearest
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            const float *ptr = bottom_blob.channel(q);
            float *output_ptr = top_blob.channel(q);
            for (int y = 0; y < oh; ++y)
            {
                const int in_y = std::min((int) (y / height_scale), (h - 1));
                for (int x = 0; x < ow; ++x)
                {
                    const int in_x = std::min((int) (x / width_scale), (w - 1));
                    output_ptr[ow * y + x] = ptr[in_y * w + in_x];
                }
            }
        }
        return 0;

    }
    else if (resize_type == 2)// bilinear
    {
        resize_bilinear(bottom_blob, top_blob, ow, oh);
        return 0;

    }
    else
    {
        fprintf(stderr, "unsupported resize type %d %d %d\n", resize_type, oh, ow);
        return -233;
    }
}